

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
          (Data<QHashPrivate::Node<SubArray,_Macro>_> *this,SubArray *key)

{
  SubArray *in_RDI;
  Bucket BVar1;
  size_t hash;
  size_t in_stack_ffffffffffffffc8;
  undefined1 in_stack_fffffffffffffff0 [16];
  
  calculateHash<SubArray>(in_RDI,in_stack_ffffffffffffffc8);
  BVar1 = findBucketWithHash<SubArray>
                    (in_stack_fffffffffffffff0._8_8_,in_stack_fffffffffffffff0._0_8_,(size_t)in_RDI)
  ;
  return BVar1;
}

Assistant:

Bucket findBucket(const K &key) const noexcept
    {
        size_t hash = QHashPrivate::calculateHash(key, seed);
        return findBucketWithHash(key, hash);
    }